

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_fd.c
# Opt level: O0

void file_free(file_conflict *file)

{
  file_conflict *file_local;
  
  free(file->utf16name);
  free(file);
  return;
}

Assistant:

static int
file_free(struct archive *a, void *client_data)
{
	struct write_fd_data	*mine = (struct write_fd_data *)client_data;

	(void)a; /* UNUSED */
	if (mine == NULL)
		return (ARCHIVE_OK);
	free(mine);
	return (ARCHIVE_OK);
}